

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O0

bool __thiscall spvtools::opt::Function::HasEarlyReturn(Function *this)

{
  bool bVar1;
  Op opcode;
  const_reference this_00;
  pointer pBVar2;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> *this_01;
  pointer this_02;
  IRContext *this_03;
  PostDominatorAnalysis *this_04;
  Instruction *this_05;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> *this_06;
  pointer b;
  byte local_51;
  undefined1 local_48 [16];
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> *block;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  *__range2;
  PostDominatorAnalysis *post_dominator_analysis;
  Function *this_local;
  
  this_00 = std::
            vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
            ::front(&this->blocks_);
  pBVar2 = std::
           unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
           operator->(this_00);
  this_01 = BasicBlock::GetLabel(pBVar2);
  this_02 = std::
            unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ::operator->(this_01);
  this_03 = Instruction::context(this_02);
  this_04 = IRContext::GetPostDominatorAnalysis(this_03,this);
  __end2 = std::
           vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
           ::begin(&this->blocks_);
  block = (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> *)
          std::
          vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
          ::end(&this->blocks_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_*,_std::vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>_>
                                *)&block);
    if (!bVar1) {
      return false;
    }
    local_48._8_8_ =
         __gnu_cxx::
         __normal_iterator<const_std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_*,_std::vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>_>
         ::operator*(&__end2);
    std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
    operator->((unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                *)local_48._8_8_);
    BasicBlock::tail((BasicBlock *)local_48);
    this_05 = utils::IntrusiveList<spvtools::opt::Instruction>::
              iterator_template<spvtools::opt::Instruction>::operator->
                        ((iterator_template<spvtools::opt::Instruction> *)local_48);
    opcode = Instruction::opcode(this_05);
    bVar1 = spvOpcodeIsReturn(opcode);
    local_51 = 0;
    if (bVar1) {
      pBVar2 = std::
               unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
               ::get((unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                      *)local_48._8_8_);
      this_06 = entry(this);
      b = std::
          unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
          get(this_06);
      bVar1 = DominatorAnalysisBase::Dominates(&this_04->super_DominatorAnalysisBase,pBVar2,b);
      local_51 = bVar1 ^ 0xff;
    }
    if ((local_51 & 1) != 0) break;
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_*,_std::vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>_>
    ::operator++(&__end2);
  }
  return true;
}

Assistant:

bool Function::HasEarlyReturn() const {
  auto post_dominator_analysis =
      blocks_.front()->GetLabel()->context()->GetPostDominatorAnalysis(this);
  for (auto& block : blocks_) {
    if (spvOpcodeIsReturn(block->tail()->opcode()) &&
        !post_dominator_analysis->Dominates(block.get(), entry().get())) {
      return true;
    }
  }
  return false;
}